

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O2

void duckdb::PartitionedColumnData::BuildPartitionSel<false>
               (PartitionedColumnDataAppendState *state,idx_t append_count)

{
  perfect_map_t<list_entry_t> *this;
  VectorType VVar1;
  uint64_t uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  __node_base *p_Var5;
  InternalException *this_00;
  _Hash_node_base *p_Var6;
  key_type *__k;
  idx_t i;
  key_type *__k_00;
  idx_t iVar7;
  allocator local_51;
  string local_50;
  
  this = &state->partition_entries;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this->_M_h);
  __k = (key_type *)(state->partition_indices).data;
  VVar1 = (state->partition_indices).vector_type;
  if (VVar1 == CONSTANT_VECTOR) {
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,__k);
    pmVar4->offset = 0;
    pmVar4->length = append_count;
  }
  else {
    iVar7 = append_count;
    __k_00 = __k;
    if (VVar1 != FLAT_VECTOR) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Unexpected VectorType in PartitionedTupleData::Append",
                 &local_51);
      InternalException::InternalException(this_00,&local_50);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    while (iVar7 != 0) {
      iVar3 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this->_M_h,__k_00);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::list_entry_t>,_true>.
          _M_cur == (__node_type *)0x0) {
        pmVar4 = ::std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,__k_00);
        pmVar4->offset = 0;
        pmVar4->length = 1;
      }
      else {
        *(long *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::list_entry_t>,_true>
                        ._M_cur + 0x18) =
             *(long *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::list_entry_t>,_true>
                             ._M_cur + 0x18) + 1;
      }
      iVar7 = iVar7 - 1;
      __k_00 = __k_00 + 1;
    }
  }
  if ((state->partition_entries)._M_h._M_element_count != 1) {
    p_Var5 = &(state->partition_entries)._M_h._M_before_begin;
    p_Var6 = (_Hash_node_base *)0x0;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor = p_Var6;
      p_Var6 = (_Hash_node_base *)((long)&(p_Var5[3]._M_nxt)->_M_nxt + (long)&p_Var6->_M_nxt);
    }
    for (iVar7 = 0; append_count != iVar7; iVar7 = iVar7 + 1) {
      pmVar4 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::list_entry_t>,_std::allocator<std::pair<const_unsigned_long,_duckdb::list_entry_t>_>,_std::__detail::_Select1st,_duckdb::PerfectEquality,_duckdb::PerfectHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,__k);
      uVar2 = pmVar4->offset;
      pmVar4->offset = uVar2 + 1;
      (state->partition_sel).sel_vector[uVar2] = (sel_t)iVar7;
      __k = __k + 1;
    }
  }
  return;
}

Assistant:

void PartitionedColumnData::BuildPartitionSel(PartitionedColumnDataAppendState &state, const idx_t append_count) {
	using GETTER = TemplatedMapGetter<list_entry_t, fixed>;
	auto &partition_entries = state.GetMap<fixed>();
	partition_entries.clear();
	const auto partition_indices = FlatVector::GetData<idx_t>(state.partition_indices);
	switch (state.partition_indices.GetVectorType()) {
	case VectorType::FLAT_VECTOR:
		for (idx_t i = 0; i < append_count; i++) {
			const auto &partition_index = partition_indices[i];
			auto partition_entry = partition_entries.find(partition_index);
			if (partition_entry == partition_entries.end()) {
				partition_entries[partition_index] = list_entry_t(0, 1);
			} else {
				GETTER::GetValue(partition_entry).length++;
			}
		}
		break;
	case VectorType::CONSTANT_VECTOR:
		partition_entries[partition_indices[0]] = list_entry_t(0, append_count);
		break;
	default:
		throw InternalException("Unexpected VectorType in PartitionedTupleData::Append");
	}

	// Early out: check if everything belongs to a single partition
	if (partition_entries.size() == 1) {
		return;
	}

	// Compute offsets from the counts
	idx_t offset = 0;
	for (auto it = partition_entries.begin(); it != partition_entries.end(); ++it) {
		auto &partition_entry = GETTER::GetValue(it);
		partition_entry.offset = offset;
		offset += partition_entry.length;
	}

	// Now initialize a single selection vector that acts as a selection vector for every partition
	auto &partition_sel = state.partition_sel;
	for (idx_t i = 0; i < append_count; i++) {
		const auto &partition_index = partition_indices[i];
		auto &partition_offset = partition_entries[partition_index].offset;
		partition_sel[partition_offset++] = UnsafeNumericCast<sel_t>(i);
	}
}